

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_interface_block(CompilerGLSL *this,SPIRVariable *var)

{
  ID *__k;
  uint *puVar1;
  size_t sVar2;
  bool *pbVar3;
  uint64_t uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  SPIRType *type;
  mapped_type *pmVar8;
  undefined4 extraout_var;
  SPIRFunction *pSVar9;
  iterator iVar10;
  SPIREntryPoint *pSVar11;
  SPIRType *pSVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint uVar13;
  uint uVar14;
  TypedID<(spirv_cross::Types)0> *in_R9;
  ulong uVar15;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  long lVar16;
  string sStack_c8;
  string block_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  TypedID<(spirv_cross::Types)1> *local_40;
  char *qual;
  
  type = Compiler::get<spirv_cross::SPIRType>
                   (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
  __k = &(type->super_IVariant).self;
  pmVar8 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,__k);
  uVar4 = (pmVar8->decoration).decoration_flags.lower;
  iVar7 = (*(this->super_Compiler)._vptr_Compiler[0x2c])(this,var);
  qual = (char *)CONCAT44(extraout_var,iVar7);
  if ((uVar4 & 4) != 0) {
    if ((this->options).force_flattened_io_blocks == false) {
      bVar6 = (this->options).es;
      uVar13 = (this->options).version;
      uVar14 = 0x95;
      if (bVar6 != false) {
        uVar14 = 0x135;
      }
      if (uVar14 < uVar13) {
        if (uVar13 < 0x140 && bVar6 == true) {
          ::std::__cxx11::string::string
                    ((string *)&block_name,"GL_EXT_geometry_shader",(allocator *)&local_80);
          bVar6 = has_extension(this,&block_name);
          if (!bVar6) {
            ::std::__cxx11::string::string
                      ((string *)&sStack_c8,"GL_EXT_tessellation_shader",(allocator *)&local_60);
            bVar6 = has_extension(this,&sStack_c8);
            ::std::__cxx11::string::~string((string *)&sStack_c8);
            ::std::__cxx11::string::~string((string *)&block_name);
            if (bVar6) goto LAB_0020b9ee;
            ::std::__cxx11::string::string
                      ((string *)&block_name,"GL_EXT_shader_io_blocks",(allocator *)&sStack_c8);
            require_extension_internal(this,&block_name);
          }
          ::std::__cxx11::string::~string((string *)&block_name);
        }
LAB_0020b9ee:
        (*(this->super_Compiler)._vptr_Compiler[6])
                  (&block_name,this,(ulong)(type->super_IVariant).self.id,0);
        this_00 = &(this->block_output_names)._M_h;
        if (type->storage == StorageClassInput) {
          this_00 = &(this->block_input_names)._M_h;
        }
        if ((block_name._M_string_length == 0) ||
           (iVar10 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find(this_00,&block_name),
           iVar10.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur != (__node_type *)0x0)) {
          (*(this->super_Compiler)._vptr_Compiler[3])(&sStack_c8,this,(ulong)__k->id);
          ::std::__cxx11::string::_M_assign((string *)&block_name);
          ::std::__cxx11::string::~string((string *)&sStack_c8);
        }
        else {
          ::std::__detail::
          _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this_00,&block_name);
        }
        if (block_name._M_string_length == 0) {
          pSVar12 = Compiler::get<spirv_cross::SPIRType>
                              (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
          join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                    (&sStack_c8,(spirv_cross *)0x30ed65,
                     (char (*) [2])&(pSVar12->super_IVariant).self,
                     (TypedID<(spirv_cross::Types)0> *)0x30ed65,
                     (char (*) [2])&(var->super_IVariant).self,in_R9);
          ::std::__cxx11::string::operator=((string *)&block_name,(string *)&sStack_c8);
          ::std::__cxx11::string::~string((string *)&sStack_c8);
        }
        ::std::__detail::
        _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&this->resource_names,&block_name);
        layout_for_variable_abi_cxx11_(&sStack_c8,this,var);
        statement<std::__cxx11::string,char_const*&,std::__cxx11::string&>
                  (this,&sStack_c8,&qual,&block_name);
        ::std::__cxx11::string::~string((string *)&sStack_c8);
        begin_scope(this);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&(type->member_name_cache)._M_h);
        local_40 = (type->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
        uVar15 = 0;
        for (lVar16 = (type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size <<
                      2; lVar16 != 0; lVar16 = lVar16 + -4) {
          add_member_name(this,type,(uint32_t)uVar15);
          uVar13 = local_40[uVar15].id;
          ::std::__cxx11::string::string((string *)&sStack_c8,"",(allocator *)&local_80);
          (*(this->super_Compiler)._vptr_Compiler[0x15])
                    (this,type,(ulong)uVar13,uVar15 & 0xffffffff,&sStack_c8,0);
          ::std::__cxx11::string::~string((string *)&sStack_c8);
          uVar15 = uVar15 + 1;
        }
        add_resource_name(this,(var->super_IVariant).self.id);
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        (*(this->super_Compiler)._vptr_Compiler[6])
                  (&local_80,this,(ulong)(var->super_IVariant).self.id);
        (*(this->super_Compiler)._vptr_Compiler[0x23])(&local_60,this,type);
        join<std::__cxx11::string,std::__cxx11::string>
                  (&sStack_c8,(spirv_cross *)&local_80,&local_60,ts_1);
        end_scope_decl(this,&sStack_c8);
        ::std::__cxx11::string::~string((string *)&sStack_c8);
        ::std::__cxx11::string::~string((string *)&local_60);
        ::std::__cxx11::string::~string((string *)&local_80);
        statement<char_const(&)[1]>(this,(char (*) [1])0x303078);
        ::std::__cxx11::string::~string((string *)&block_name);
        return;
      }
    }
    goto LAB_0020ba6b;
  }
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    if ((this->options).force_flattened_io_blocks != false) {
LAB_0020ba6b:
      emit_flattened_io_block(this,var,qual);
      return;
    }
    uVar13 = 0x95;
    if ((this->options).es != false) {
      uVar13 = 0x135;
    }
    if ((this->options).version <= uVar13) goto LAB_0020ba6b;
  }
  add_resource_name(this,(var->super_IVariant).self.id);
  bVar6 = true;
  if (((type->storage != StorageClassInput) ||
      ((type->array).super_VectorView<unsigned_int>.buffer_size == 0)) ||
     (bVar5 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationPatch),
     bVar5)) {
    bVar5 = false;
    uVar13 = 0;
  }
  else {
    pSVar11 = Compiler::get_entry_point(&this->super_Compiler);
    if (pSVar11->model != ExecutionModelTessellationControl) {
      pSVar11 = Compiler::get_entry_point(&this->super_Compiler);
      bVar5 = false;
      uVar13 = 0;
      if (pSVar11->model != ExecutionModelTessellationEvaluation) goto LAB_0020b7fb;
    }
    puVar1 = (type->array).super_VectorView<unsigned_int>.ptr;
    sVar2 = (type->array).super_VectorView<unsigned_int>.buffer_size;
    uVar13 = puVar1[sVar2 - 1];
    puVar1[sVar2 - 1] = 0;
    pbVar3 = (type->array_size_literal).super_VectorView<bool>.ptr;
    sVar2 = (type->array_size_literal).super_VectorView<bool>.buffer_size;
    bVar6 = pbVar3[sVar2 - 1];
    pbVar3[sVar2 - 1] = true;
    bVar5 = true;
  }
LAB_0020b7fb:
  layout_for_variable_abi_cxx11_(&block_name,this,var);
  (*(this->super_Compiler)._vptr_Compiler[0x2b])
            (&sStack_c8,this,(ulong)(var->super_IVariant).self.id);
  (*(this->super_Compiler)._vptr_Compiler[6])(&local_60,this,(ulong)(var->super_IVariant).self.id,1)
  ;
  (*(this->super_Compiler)._vptr_Compiler[0x1a])
            (&local_80,this,type,&local_60,(ulong)(var->super_IVariant).self.id);
  statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
            (this,&block_name,&sStack_c8,&local_80,(char (*) [2])0x304bae);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&sStack_c8);
  ::std::__cxx11::string::~string((string *)&block_name);
  if (bVar5) {
    (type->array).super_VectorView<unsigned_int>.ptr
    [(type->array).super_VectorView<unsigned_int>.buffer_size - 1] = uVar13;
    (type->array_size_literal).super_VectorView<bool>.ptr
    [(type->array_size_literal).super_VectorView<bool>.buffer_size - 1] = bVar6;
  }
  if ((var->storage == StorageClassOutput) && ((var->initializer).id != 0)) {
    pSVar9 = Compiler::get<spirv_cross::SPIRFunction>
                       (&this->super_Compiler,(this->super_Compiler).ir.default_entry_point.id);
    block_name.field_2._8_8_ =
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp:2417:9)>
         ::_M_invoke;
    block_name.field_2._M_allocated_capacity =
         (size_type)
         ::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp:2417:9)>
         ::_M_manager;
    block_name._M_dataplus._M_p = (pointer)this;
    block_name._M_string_length = (size_type)var;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar9->fixup_hooks_in,(function<void_()> *)&block_name);
    ::std::_Function_base::~_Function_base((_Function_base *)&block_name);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_interface_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	// Either make it plain in/out or in/out blocks depending on what shader is doing ...
	bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);
	const char *qual = to_storage_qualifiers_glsl(var);

	if (block)
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		    (!options.es && options.version < 150))
		{
			// I/O blocks on ES require version 310 with Android Extension Pack extensions, or core version 320.
			// On desktop, I/O blocks were introduced with geometry shaders in GL 3.2 (GLSL 150).
			emit_flattened_io_block(var, qual);
		}
		else
		{
			if (options.es && options.version < 320)
			{
				// Geometry and tessellation extensions imply this extension.
				if (!has_extension("GL_EXT_geometry_shader") && !has_extension("GL_EXT_tessellation_shader"))
					require_extension_internal("GL_EXT_shader_io_blocks");
			}

			// Block names should never alias.
			auto block_name = to_name(type.self, false);

			// The namespace for I/O blocks is separate from other variables in GLSL.
			auto &block_namespace = type.storage == StorageClassInput ? block_input_names : block_output_names;

			// Shaders never use the block by interface name, so we don't
			// have to track this other than updating name caches.
			if (block_name.empty() || block_namespace.find(block_name) != end(block_namespace))
				block_name = get_fallback_name(type.self);
			else
				block_namespace.insert(block_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (block_name.empty())
				block_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			// Instance names cannot alias block names.
			resource_names.insert(block_name);

			statement(layout_for_variable(var), qual, block_name);
			begin_scope();

			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}

			add_resource_name(var.self);
			end_scope_decl(join(to_name(var.self), type_to_array_glsl(type)));
			statement("");
		}
	}
	else
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (type.basetype == SPIRType::Struct &&
		    (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		     (!options.es && options.version < 150)))
		{
			emit_flattened_io_block(var, qual);
		}
		else
		{
			add_resource_name(var.self);

			// Tessellation control and evaluation shaders must have either gl_MaxPatchVertices or unsized arrays for input arrays.
			// Opt for unsized as it's the more "correct" variant to use.
			bool control_point_input_array = type.storage == StorageClassInput && !type.array.empty() &&
			                                 !has_decoration(var.self, DecorationPatch) &&
			                                 (get_entry_point().model == ExecutionModelTessellationControl ||
			                                  get_entry_point().model == ExecutionModelTessellationEvaluation);

			uint32_t old_array_size = 0;
			bool old_array_size_literal = true;

			if (control_point_input_array)
			{
				swap(type.array.back(), old_array_size);
				swap(type.array_size_literal.back(), old_array_size_literal);
			}

			statement(layout_for_variable(var), to_qualifiers_glsl(var.self),
			          variable_decl(type, to_name(var.self), var.self), ";");

			if (control_point_input_array)
			{
				swap(type.array.back(), old_array_size);
				swap(type.array_size_literal.back(), old_array_size_literal);
			}

			// If a StorageClassOutput variable has an initializer, we need to initialize it in main().
			if (var.storage == StorageClassOutput && var.initializer)
			{
				auto &entry_func = this->get<SPIRFunction>(ir.default_entry_point);
				entry_func.fixup_hooks_in.push_back(
				    [&]() { statement(to_name(var.self), " = ", to_expression(var.initializer), ";"); });
			}
		}
	}
}